

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_verifier.h
# Opt level: O1

int MyGame_Example_Monster_verify_table(flatcc_table_verifier_descriptor_t *td)

{
  int iVar1;
  
  iVar1 = flatcc_verify_field(td,0,0x20,0x10);
  if (iVar1 == 0) {
    iVar1 = flatcc_verify_field(td,1,2,2);
    if (iVar1 == 0) {
      iVar1 = flatcc_verify_field(td,2,2,2);
      if (iVar1 == 0) {
        iVar1 = flatcc_verify_string_field(td,3,1);
        if (iVar1 == 0) {
          iVar1 = flatcc_verify_vector_field(td,5,0,1,1,0xffffffff);
          if (iVar1 == 0) {
            iVar1 = flatcc_verify_field(td,6,1,1);
            if (iVar1 == 0) {
              iVar1 = flatcc_verify_union_field(td,8,0,MyGame_Example_Any_union_verifier);
              if (iVar1 == 0) {
                iVar1 = flatcc_verify_vector_field(td,9,0,4,2,0x3fffffff);
                if (iVar1 == 0) {
                  iVar1 = flatcc_verify_string_vector_field(td,10,0);
                  if (iVar1 == 0) {
                    iVar1 = flatcc_verify_table_vector_field
                                      (td,0xb,0,MyGame_Example_Monster_verify_table);
                    if (iVar1 == 0) {
                      iVar1 = flatcc_verify_table_field
                                        (td,0xc,0,MyGame_Example_Monster_verify_table);
                      if (iVar1 == 0) {
                        iVar1 = flatcc_verify_table_as_nested_root
                                          (td,0xd,0,(char *)0x0,1,
                                           MyGame_Example_Monster_verify_table);
                        if (iVar1 == 0) {
                          iVar1 = flatcc_verify_table_field
                                            (td,0xe,0,MyGame_Example_Stat_verify_table);
                          if (iVar1 == 0) {
                            iVar1 = flatcc_verify_field(td,0xf,1,1);
                            if (iVar1 == 0) {
                              iVar1 = flatcc_verify_field(td,0x10,4,4);
                              if (iVar1 == 0) {
                                iVar1 = flatcc_verify_field(td,0x11,4,4);
                                if (iVar1 == 0) {
                                  iVar1 = flatcc_verify_field(td,0x12,8,8);
                                  if (iVar1 == 0) {
                                    iVar1 = flatcc_verify_field(td,0x13,8,8);
                                    if (iVar1 == 0) {
                                      iVar1 = flatcc_verify_field(td,0x14,4,4);
                                      if (iVar1 == 0) {
                                        iVar1 = flatcc_verify_field(td,0x15,4,4);
                                        if (iVar1 == 0) {
                                          iVar1 = flatcc_verify_field(td,0x16,8,8);
                                          if (iVar1 == 0) {
                                            iVar1 = flatcc_verify_field(td,0x17,8,8);
                                            if (iVar1 == 0) {
                                              iVar1 = flatcc_verify_vector_field
                                                                (td,0x18,0,1,1,0xffffffff);
                                              if (iVar1 == 0) {
                                                iVar1 = flatcc_verify_field(td,0x19,4,4);
                                                if (iVar1 == 0) {
                                                  iVar1 = flatcc_verify_field(td,0x1a,4,4);
                                                  if (iVar1 == 0) {
                                                    iVar1 = flatcc_verify_field(td,0x1b,4,4);
                                                    if (iVar1 == 0) {
                                                      iVar1 = flatcc_verify_string_vector_field
                                                                        (td,0x1c,0);
                                                      if (iVar1 == 0) {
                                                        iVar1 = flatcc_verify_vector_field
                                                                          (td,0x1d,0,8,4,0x1fffffff)
                                                        ;
                                                        if (iVar1 == 0) {
                                                          iVar1 = flatcc_verify_vector_field
                                                                            (td,0x1e,0,1,1,
                                                                             0xffffffff);
                                                          if (iVar1 == 0) {
                                                            iVar1 = flatcc_verify_vector_field
                                                                              (td,0x1f,0,4,2,
                                                                               0x3fffffff);
                                                            if (iVar1 == 0) {
                                                              iVar1 = flatcc_verify_vector_field
                                                                                (td,0x20,0,8,8,
                                                                                 0x1fffffff);
                                                              if (iVar1 == 0) {
                                                                iVar1 = flatcc_verify_vector_field
                                                                                  (td,0x21,0,8,8,
                                                                                   0x1fffffff);
                                                                if (iVar1 == 0) {
                                                                  iVar1 = flatcc_verify_table_field
                                                                                    (td,0x22,0,
                                                                                                                                                                          
                                                  MyGame_InParentNamespace_verify_table);
                                                  if (iVar1 == 0) {
                                                    iVar1 = flatcc_verify_table_field
                                                                      (td,0x23,0,
                                                                                                                                              
                                                  MyGame_Example_TestBase64_verify_table);
                                                  return iVar1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int MyGame_Example_Monster_verify_table(flatcc_table_verifier_descriptor_t *td)
{
    int ret;
    if ((ret = flatcc_verify_field(td, 0, 32, 16) /* pos */)) return ret;
    if ((ret = flatcc_verify_field(td, 1, 2, 2) /* mana */)) return ret;
    if ((ret = flatcc_verify_field(td, 2, 2, 2) /* hp */)) return ret;
    if ((ret = flatcc_verify_string_field(td, 3, 1) /* name */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 5, 0, 1, 1, INT64_C(4294967295)) /* inventory */)) return ret;
    if ((ret = flatcc_verify_field(td, 6, 1, 1) /* color */)) return ret;
    if ((ret = flatcc_verify_union_field(td, 8, 0, &MyGame_Example_Any_union_verifier) /* test */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 9, 0, 4, 2, INT64_C(1073741823)) /* test4 */)) return ret;
    if ((ret = flatcc_verify_string_vector_field(td, 10, 0) /* testarrayofstring */)) return ret;
    if ((ret = flatcc_verify_table_vector_field(td, 11, 0, &MyGame_Example_Monster_verify_table) /* testarrayoftables */)) return ret;
    if ((ret = flatcc_verify_table_field(td, 12, 0, &MyGame_Example_Monster_verify_table) /* enemy */)) return ret;
    if ((ret = flatcc_verify_table_as_nested_root(td, 13, 0, 0, 1, MyGame_Example_Monster_verify_table) /* testnestedflatbuffer */)) return ret;
    if ((ret = flatcc_verify_table_field(td, 14, 0, &MyGame_Example_Stat_verify_table) /* testempty */)) return ret;
    if ((ret = flatcc_verify_field(td, 15, 1, 1) /* testbool */)) return ret;
    if ((ret = flatcc_verify_field(td, 16, 4, 4) /* testhashs32_fnv1 */)) return ret;
    if ((ret = flatcc_verify_field(td, 17, 4, 4) /* testhashu32_fnv1 */)) return ret;
    if ((ret = flatcc_verify_field(td, 18, 8, 8) /* testhashs64_fnv1 */)) return ret;
    if ((ret = flatcc_verify_field(td, 19, 8, 8) /* testhashu64_fnv1 */)) return ret;
    if ((ret = flatcc_verify_field(td, 20, 4, 4) /* testhashs32_fnv1a */)) return ret;
    if ((ret = flatcc_verify_field(td, 21, 4, 4) /* testhashu32_fnv1a */)) return ret;
    if ((ret = flatcc_verify_field(td, 22, 8, 8) /* testhashs64_fnv1a */)) return ret;
    if ((ret = flatcc_verify_field(td, 23, 8, 8) /* testhashu64_fnv1a */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 24, 0, 1, 1, INT64_C(4294967295)) /* testarrayofbools */)) return ret;
    if ((ret = flatcc_verify_field(td, 25, 4, 4) /* testf */)) return ret;
    if ((ret = flatcc_verify_field(td, 26, 4, 4) /* testf2 */)) return ret;
    if ((ret = flatcc_verify_field(td, 27, 4, 4) /* testf3 */)) return ret;
    if ((ret = flatcc_verify_string_vector_field(td, 28, 0) /* testarrayofstring2 */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 29, 0, 8, 4, INT64_C(536870911)) /* testarrayofsortedstruct */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 30, 0, 1, 1, INT64_C(4294967295)) /* flex */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 31, 0, 4, 2, INT64_C(1073741823)) /* test5 */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 32, 0, 8, 8, INT64_C(536870911)) /* vector_of_longs */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 33, 0, 8, 8, INT64_C(536870911)) /* vector_of_doubles */)) return ret;
    if ((ret = flatcc_verify_table_field(td, 34, 0, &MyGame_InParentNamespace_verify_table) /* parent_namespace_test */)) return ret;
    if ((ret = flatcc_verify_table_field(td, 35, 0, &MyGame_Example_TestBase64_verify_table) /* testbase64 */)) return ret;
    return flatcc_verify_ok;
}